

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathCastToString(xmlXPathObjectPtr val)

{
  xmlGenericErrorFunc p_Var1;
  xmlChar *pxVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlXPathObjectPtr local_20;
  xmlChar *ret;
  xmlXPathObjectPtr val_local;
  
  local_20 = (xmlXPathObjectPtr)0x0;
  if (val == (xmlXPathObjectPtr)0x0) {
    val_local = (xmlXPathObjectPtr)xmlStrdup("");
  }
  else {
    switch(val->type) {
    case XPATH_UNDEFINED:
      local_20 = (xmlXPathObjectPtr)xmlStrdup("");
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      local_20 = (xmlXPathObjectPtr)xmlXPathCastNodeSetToString(val->nodesetval);
      break;
    case XPATH_BOOLEAN:
      local_20 = (xmlXPathObjectPtr)xmlXPathCastBooleanToString(val->boolval);
      break;
    case XPATH_NUMBER:
      local_20 = (xmlXPathObjectPtr)xmlXPathCastNumberToString(val->floatval);
      break;
    case XPATH_STRING:
      pxVar2 = xmlStrdup(val->stringval);
      return pxVar2;
    case XPATH_POINT:
    case XPATH_RANGE:
    case XPATH_LOCATIONSET:
    case XPATH_USERS:
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                ,0x1694);
      local_20 = (xmlXPathObjectPtr)xmlStrdup("");
    }
    val_local = local_20;
  }
  return (xmlChar *)val_local;
}

Assistant:

xmlChar *
xmlXPathCastToString(xmlXPathObjectPtr val) {
    xmlChar *ret = NULL;

    if (val == NULL)
	return(xmlStrdup((const xmlChar *) ""));
    switch (val->type) {
	case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
	    xmlGenericError(xmlGenericErrorContext, "String: undefined\n");
#endif
	    ret = xmlStrdup((const xmlChar *) "");
	    break;
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    ret = xmlXPathCastNodeSetToString(val->nodesetval);
	    break;
	case XPATH_STRING:
	    return(xmlStrdup(val->stringval));
        case XPATH_BOOLEAN:
	    ret = xmlXPathCastBooleanToString(val->boolval);
	    break;
	case XPATH_NUMBER: {
	    ret = xmlXPathCastNumberToString(val->floatval);
	    break;
	}
	case XPATH_USERS:
	case XPATH_POINT:
	case XPATH_RANGE:
	case XPATH_LOCATIONSET:
	    TODO
	    ret = xmlStrdup((const xmlChar *) "");
	    break;
    }
    return(ret);
}